

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ManFinalize(Gli_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (p->iObjData != p->nObjData) {
    __assert_fail("p->iObjData == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                  ,0xe1,"void Gli_ManFinalize(Gli_Man_t *)");
  }
  if (0 < p->nObjData) {
    uVar3 = 0;
    do {
      piVar1 = p->pObjData;
      if (piVar1 == (int *)0x0) {
        return;
      }
      uVar4 = (uint)piVar1[uVar3] >> 4 & 7;
      if (piVar1[(ulong)uVar3 + 5] != uVar4) {
        __assert_fail("pObj->iFanin == (int)pObj->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                      ,0xe4,"void Gli_ManFinalize(Gli_Man_t *)");
      }
      uVar2 = (uint)piVar1[uVar3] >> 7;
      if (piVar1[(ulong)uVar3 + 6] != uVar2) {
        __assert_fail("pObj->iFanout == (int)pObj->nFanouts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                      ,0xe5,"void Gli_ManFinalize(Gli_Man_t *)");
      }
      (piVar1 + (ulong)uVar3 + 5)[0] = 0;
      (piVar1 + (ulong)uVar3 + 5)[1] = 0;
      uVar3 = uVar2 + uVar3 + uVar4 + 8;
    } while ((int)uVar3 < p->nObjData);
  }
  return;
}

Assistant:

void Gli_ManFinalize( Gli_Man_t * p )
{
    Gli_Obj_t * pObj;
    int i;
    assert( p->iObjData == p->nObjData );
    Gli_ManForEachObj( p, pObj, i )
    {
        assert( pObj->iFanin == (int)pObj->nFanins );
        assert( pObj->iFanout == (int)pObj->nFanouts );
        pObj->iFanin = 0;
        pObj->iFanout = 0;
    }
}